

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void util_makepath(char *path)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  char *__path;
  char *pcVar3;
  int *piVar4;
  
  if ((path != (char *)0x0) && (*path != '/')) {
    __path = strdup(path);
    pcVar3 = __path;
    do {
      pcVar3 = strchr(pcVar3,0x2f);
      if (pcVar3 == (char *)0x0) {
        free(__path);
        return;
      }
      *pcVar3 = '\0';
      iVar2 = mkdir(__path,0x1ff);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        __stream = _stderr;
        pcVar1 = argv0;
        if (*piVar4 != 0x11) {
          pcVar3 = strerror(*piVar4);
          fprintf(__stream,"%s: couldn\'t create directory %s: %s\n",pcVar1,__path,pcVar3);
          abort();
        }
      }
      *pcVar3 = '/';
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  fprintf(_stderr,"%s: invalid path: %s\n",argv0);
  abort();
}

Assistant:

void
util_makepath(
    const char* path)
{
    char* name;
    char* filename;

    /* TODO: Implement something like this for Windows. */
    if (!path || path[0] == '/') {
        fprintf(stderr, "%s: invalid path: %s\n", argv0, path);
        abort();
    }

    name = strdup(path);
    filename = name;

    for (;;) {
        filename = strchr(filename, '/');
        if (!filename)
            break;
        *filename = '\0';

#ifdef _WIN32
        if (CreateDirectory(name, NULL) == 0 && GetLastError() != ERROR_ALREADY_EXISTS) {
            fprintf(stderr, "%s: couldn't create directory %s\n",
                argv0, name);
            abort();
        }
#else
        if (mkdir(name, 0777) == -1
#ifdef EEXIST
            && errno != EEXIST
#endif
            ) {
            fprintf(stderr, "%s: couldn't create directory %s: %s\n",
                argv0, name, strerror(errno));
            abort();
        }
#endif

        *filename = '/';
        ++filename;
    }

    free(name);
}